

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenChain.h
# Opt level: O0

void __thiscall adios2::shm::TokenChain<unsigned_long>::~TokenChain(TokenChain<unsigned_long> *this)

{
  long in_RDI;
  Win *in_stack_ffffffffffffffa8;
  Comm *in_stack_ffffffffffffffb0;
  string local_28 [40];
  
  if (*(int *)(in_RDI + 0xc) < 2) {
    if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0x18));
    }
  }
  else {
    std::__cxx11::string::string(local_28);
    helper::Comm::Win_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(string *)0xa9cd42);
    std::__cxx11::string::~string(local_28);
  }
  helper::Comm::Win::~Win((Win *)0xa9cd7e);
  return;
}

Assistant:

~TokenChain()
    {
        if (m_nProc > 1)
        {
            m_NodeComm->Win_free(m_Win);
        }
        else
        {
            delete m_Shm;
        }
    }